

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

string * __thiscall
pfederc::ArrayEmptyExpr::toString_abi_cxx11_(string *__return_storage_ptr__,ArrayEmptyExpr *this)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_50;
  ulong local_48;
  long local_40;
  long lStack_38;
  long *local_30 [2];
  long local_20 [2];
  
  (*((this->typeExpr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
     ._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(local_30);
  plVar2 = (long *)std::__cxx11::string::insert((ulong)local_30,0,'\x01');
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_40 = *plVar3;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar3;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ArrayEmptyExpr::toString() const noexcept {
  return '[' + typeExpr->toString() + ']';
}